

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O1

void DumpData(PtexTexture *r,int faceid,bool dumpall)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *__ptr;
  ostream *poVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  long lVar8;
  uint uVar9;
  PtexReader *R;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar12 = 1;
  if (r != (PtexTexture *)0x0 && dumpall) {
    uVar12 = (uint)*(ushort *)((long)&r[0x13]._vptr_PtexTexture + 6);
  }
  iVar2 = (*r->_vptr_PtexTexture[0x10])(r,(ulong)(uint)faceid);
  uVar3 = (*r->_vptr_PtexTexture[0xb])(r);
  __ptr = malloc((long)(int)uVar3 << 2);
  if (uVar12 != 0) {
    uVar7 = *(ushort *)CONCAT44(extraout_var,iVar2);
    if (('\0' < (char)uVar7) && (uVar1 = uVar7 >> 8, '\0' < (char)(uVar7 >> 8))) {
      do {
        bVar5 = (byte)uVar7;
        uVar11 = 1 << (bVar5 & 0x1f);
        bVar6 = (byte)uVar1;
        uVar14 = 1 << (bVar6 & 0x1f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  data (",8);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," x ",3);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        if ((*(byte *)((long)CONCAT44(extraout_var,iVar2) + 3) & 1) != 0) {
          uVar11 = 1;
          uVar14 = 1;
        }
        if (uVar14 != 1 || uVar11 != 1) {
          lVar8 = 1;
          pcVar10 = ":";
        }
        else {
          lVar8 = 9;
          pcVar10 = ", const: ";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
        if (0 < (int)uVar14) {
          uVar9 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar15 = 0;
              do {
                if (uVar14 != 1 || uVar11 != 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n    (",6);
                  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar15);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"): ",3);
                }
                (*r->_vptr_PtexTexture[0x16])
                          (r,(ulong)(uint)faceid,(ulong)uVar15,(ulong)uVar9,__ptr,0,
                           CONCAT44(extraout_var_00,uVar3),(ulong)CONCAT11(bVar6,bVar5));
                if (0 < (int)uVar3) {
                  uVar13 = 0;
                  do {
                    printf(" %.3f",(double)*(float *)((long)__ptr + uVar13 * 4));
                    uVar13 = uVar13 + 1;
                  } while (uVar3 != uVar13);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar11);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar14);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
        uVar12 = uVar12 - 1;
        if ((uVar12 == 0) || ((char)bVar5 < '\x02')) break;
        uVar7 = (ushort)(byte)(bVar5 - 1);
        uVar1 = uVar1 - 1;
      } while ('\x01' < (char)bVar6);
    }
  }
  free(__ptr);
  return;
}

Assistant:

void DumpData(PtexTexture* r, int faceid, bool dumpall)
{
    int levels = 1;
    if (dumpall) {
        PtexReader* R = static_cast<PtexReader*> (r);
        if (R) levels = R->header().nlevels;
    }

    const Ptex::FaceInfo& f = r->getFaceInfo(faceid);
    int nchan = r->numChannels();
    float* pixel = (float*) malloc(sizeof(float)*nchan);
    Ptex::Res res = f.res;
    while (levels && res.ulog2 >= 1 && res.vlog2 >= 1) {
        int ures = res.u(), vres = res.v();
        std::cout << "  data (" << ures << " x " << vres << ")";
        if (f.isConstant()) { ures = vres = 1; }
        bool isconst = (ures == 1 && vres == 1);
        if (isconst) std::cout << ", const: ";
        else std::cout << ":";
        for (int vi = 0; vi < vres; vi++) {
            for (int ui = 0; ui < ures; ui++) {
                if (!isconst) std::cout << "\n    (" << ui << ", " << vi << "): ";
                r->getPixel(faceid, ui, vi, pixel, 0, nchan, res);
                for (int c=0; c < nchan; c++) {
                    printf(" %.3f", pixel[c]);
                }
            }
        }
        std::cout << std::endl;
        res.ulog2--;
        res.vlog2--;
        levels--;
    }
    free(pixel);
}